

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O0

void __thiscall
MADPComponentDiscreteActions::MADPComponentDiscreteActions
          (MADPComponentDiscreteActions *this,MADPComponentDiscreteActions *a)

{
  bool bVar1;
  size_t *psVar2;
  ulong uVar3;
  size_type sVar4;
  JointActionDiscrete *this_00;
  void *__s;
  long in_RSI;
  undefined8 *in_RDI;
  pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*> pVar5;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_int,_vector<unsigned_int>_*>_>::value,_pair<iterator,_bool>_>
  _Var6;
  const_iterator iter;
  Index ja;
  map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
  *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  in_stack_ffffffffffffff08;
  JointActionDiscrete *in_stack_ffffffffffffff38;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff50;
  vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
  *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  iterator local_50;
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  local_48;
  iterator local_40;
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  local_38;
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  local_30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_28;
  uint local_20;
  long local_10;
  
  *in_RDI = &PTR__MADPComponentDiscreteActions_00d3fa78;
  local_10 = in_RSI;
  std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>::vector
            ((vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_> *)0xacc493);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xacc4ac);
  std::
  vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
  ::vector((vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
            *)0xacc4c2);
  *(byte *)(in_RDI + 1) = *(byte *)(local_10 + 8) & 1;
  *(byte *)((long)in_RDI + 9) = *(byte *)(local_10 + 9) & 1;
  *(byte *)((long)in_RDI + 10) = *(byte *)(local_10 + 10) & 1;
  in_RDI[2] = *(undefined8 *)(local_10 + 0x10);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff98);
  psVar2 = IndexTools::CalculateStepSize
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_ffffffffffffff08._M_node);
  in_RDI[3] = psVar2;
  std::
  vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
  ::operator=((vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
               *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
              in_stack_ffffffffffffff98);
  std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>::clear
            ((vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_> *)0xacc579);
  for (local_20 = 0; uVar3 = (ulong)local_20,
      sVar4 = std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>::size
                        ((vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_> *)
                         (local_10 + 0x20)), uVar3 != sVar4; local_20 = local_20 + 1) {
    in_stack_ffffffffffffff48 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 4);
    in_stack_ffffffffffffff50 =
         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x48);
    this_00 = (JointActionDiscrete *)
              std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>::at
                        ((vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_> *)
                         CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                         (size_type)in_stack_fffffffffffffef8);
    JointActionDiscrete::JointActionDiscrete(this_00,in_stack_ffffffffffffff38);
    local_28 = in_stack_ffffffffffffff50;
    std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>::push_back
              ((vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_> *)
               CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
               (value_type *)in_stack_fffffffffffffef8);
  }
  __s = operator_new(0x30);
  memset(__s,0,0x30);
  std::
  map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
  ::map((map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
         *)0xacc6af);
  in_RDI[7] = __s;
  if (*(long *)(local_10 + 0x38) != 0) {
    std::
    _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
    ::_Rb_tree_const_iterator(&local_30);
    local_40._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
         ::begin(in_stack_fffffffffffffef8);
    std::
    _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
    ::_Rb_tree_const_iterator(&local_38,&local_40);
    local_30._M_node = local_38._M_node;
    while( true ) {
      local_50._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
           ::end(in_stack_fffffffffffffef8);
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ::_Rb_tree_const_iterator(&local_48,&local_50);
      bVar1 = std::operator!=(&local_30,&local_48);
      if (!bVar1) break;
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                    *)0xacc788);
      operator_new(0x18);
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                    *)0xacc7ab);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      pVar5 = std::
              make_pair<unsigned_int_const&,std::vector<unsigned_int,std::allocator<unsigned_int>>*>
                        ((uint *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                         in_stack_fffffffffffffef8);
      _Var6 = std::
              map<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>>
              ::
              insert<std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>
                        ((map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
                          *)pVar5.second,
                         (pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>
                          *)in_stack_ffffffffffffff08._M_node);
      in_stack_ffffffffffffff08 = _Var6.first._M_node;
      in_stack_ffffffffffffff07 = _Var6.second;
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                    *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    }
  }
  return;
}

Assistant:

MADPComponentDiscreteActions::MADPComponentDiscreteActions(
    const MADPComponentDiscreteActions& a)
{
    _m_initialized=a._m_initialized;
    _m_cachedAllJointActions=a._m_cachedAllJointActions;
    _m_jointIndicesValid=a._m_jointIndicesValid;
    _m_nrJointActions=a._m_nrJointActions;
    _m_nrActions=a._m_nrActions;
    _m_actionStepSize=IndexTools::CalculateStepSize(_m_nrActions);
    _m_actionVecs=a._m_actionVecs;

    _m_jointActionVec.clear();
    for(Index ja=0;ja!=a._m_jointActionVec.size();++ja)
        _m_jointActionVec.push_back(new JointActionDiscrete(*a._m_jointActionVec.at(ja)));

    _m_jointActionIndices=new map<Index, vector<Index> *>();
    if(a._m_jointActionIndices)
    {
        map<Index, vector<Index> *>::const_iterator iter;
        for(iter = a._m_jointActionIndices->begin();
            iter != a._m_jointActionIndices->end();
            ++iter)
            _m_jointActionIndices->insert(make_pair( iter->first, new vector<Index>(*iter->second ))); 
    }
}